

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O2

void __thiscall OpenMD::ReplacementVisitor::~ReplacementVisitor(ReplacementVisitor *this)

{
  ~ReplacementVisitor(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

ReplacementVisitor(SimInfo* info) : BaseAtomVisitor(info) {
      visitorName = "ReplacementVisitor";
      sites_      = std::make_shared<AtomData>();
    }